

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifier.cpp
# Opt level: O0

void meshopt::quadricAdd(Quadric *Q,Quadric *R)

{
  Quadric *R_local;
  Quadric *Q_local;
  
  Q->a00 = R->a00 + Q->a00;
  Q->a11 = R->a11 + Q->a11;
  Q->a22 = R->a22 + Q->a22;
  Q->a10 = R->a10 + Q->a10;
  Q->a20 = R->a20 + Q->a20;
  Q->a21 = R->a21 + Q->a21;
  Q->b0 = R->b0 + Q->b0;
  Q->b1 = R->b1 + Q->b1;
  Q->b2 = R->b2 + Q->b2;
  Q->c = R->c + Q->c;
  Q->w = R->w + Q->w;
  return;
}

Assistant:

static void quadricAdd(Quadric& Q, const Quadric& R)
{
	Q.a00 += R.a00;
	Q.a11 += R.a11;
	Q.a22 += R.a22;
	Q.a10 += R.a10;
	Q.a20 += R.a20;
	Q.a21 += R.a21;
	Q.b0 += R.b0;
	Q.b1 += R.b1;
	Q.b2 += R.b2;
	Q.c += R.c;
	Q.w += R.w;
}